

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O3

void walk_binary_expr(CompilerState *compiler_state,AstNode *node,AstNodeList **expr_list)

{
  AstNode *node_00;
  bool bVar1;
  
  bVar1 = node->type == EXPR_BINARY;
  do {
    if ((!bVar1) || ((node->field_2).unary_expr.unary_op != 0xc)) {
      __assert_fail("node->type == EXPR_BINARY && node->binary_expr.binary_op == BINOPR_CONCAT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_simplify.c"
                    ,0x173,"void walk_binary_expr(CompilerState *, AstNode *, AstNodeList **)");
    }
    node_00 = (node->field_2).function_stmt.function_expr;
    node = (node->field_2).binary_expr.expr_right;
    if ((node_00->type == EXPR_BINARY) && ((node_00->field_2).unary_expr.unary_op == 0xc)) {
      walk_binary_expr(compiler_state,node_00,expr_list);
    }
    else {
      raviX_ptrlist_add((PtrList **)expr_list,node_00,compiler_state->allocator);
    }
  } while ((node->type == EXPR_BINARY) && (bVar1 = true, (node->field_2).unary_expr.unary_op == 0xc)
          );
  raviX_ptrlist_add((PtrList **)expr_list,node,compiler_state->allocator);
  return;
}

Assistant:

static void walk_binary_expr(CompilerState *compiler_state, AstNode *node, AstNodeList **expr_list) {
	assert(node->type == EXPR_BINARY && node->binary_expr.binary_op == BINOPR_CONCAT);
	AstNode *left = node->binary_expr.expr_left;
	AstNode *right = node->binary_expr.expr_right;
	if (left->type == EXPR_BINARY && left->binary_expr.binary_op == BINOPR_CONCAT) {
		walk_binary_expr(compiler_state, left, expr_list);
	} else {
		raviX_ptrlist_add((PtrList **)expr_list, left, compiler_state->allocator);
	}
	if (right->type == EXPR_BINARY && right->binary_expr.binary_op == BINOPR_CONCAT) {
		walk_binary_expr(compiler_state, right, expr_list);
	} else {
		raviX_ptrlist_add((PtrList **)expr_list, right, compiler_state->allocator);
	}
}